

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

int State_insert(state *data,config *key)

{
  s_x3node **ppsVar1;
  s_x3 *psVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  s_x3node *psVar7;
  s_x3node *psVar8;
  s_x3node *psVar9;
  state *psVar10;
  config *in_RSI;
  state *in_RDI;
  x3node *newnp;
  x3node *oldnp;
  s_x3 array;
  int arrSize;
  int i;
  uint ph;
  uint h;
  x3node *np;
  int local_2c;
  s_x3node *local_20;
  int local_4;
  
  if (x3a == (s_x3 *)0x0) {
    local_4 = 0;
  }
  else {
    uVar3 = statehash(in_RSI);
    for (local_20 = x3a->ht[uVar3 & x3a->size - 1U]; local_20 != (s_x3node *)0x0;
        local_20 = local_20->next) {
      iVar4 = statecmp(local_20->key,in_RSI);
      if (iVar4 == 0) {
        return 0;
      }
    }
    if (x3a->size <= x3a->count) {
      iVar5 = x3a->size * 2;
      iVar4 = x3a->count;
      psVar7 = (s_x3node *)calloc((long)iVar5,0x28);
      if (psVar7 == (s_x3node *)0x0) {
        return 0;
      }
      psVar8 = psVar7 + iVar5;
      for (local_2c = 0; local_2c < iVar5; local_2c = local_2c + 1) {
        (&psVar8->data)[local_2c] = (state *)0x0;
      }
      for (local_2c = 0; local_2c < x3a->count; local_2c = local_2c + 1) {
        psVar9 = x3a->tbl + local_2c;
        uVar6 = statehash(psVar9->key);
        uVar6 = uVar6 & iVar5 - 1U;
        psVar10 = (state *)(psVar7 + local_2c);
        if ((&psVar8->data)[uVar6] != (state *)0x0) {
          (&psVar8->data)[uVar6]->ap = (action *)&psVar10->statenum;
        }
        *(state **)&psVar10->statenum = (&psVar8->data)[uVar6];
        psVar10->cfp = psVar9->key;
        psVar10->bp = (config *)psVar9->data;
        psVar10->ap = (action *)(&psVar8->data + uVar6);
        (&psVar8->data)[uVar6] = psVar10;
      }
      free(x3a->tbl);
      psVar2 = x3a;
      psVar2->size = iVar5;
      psVar2->count = iVar4;
      psVar2->tbl = psVar7;
      psVar2->ht = (s_x3node **)psVar8;
    }
    uVar3 = uVar3 & x3a->size - 1U;
    ppsVar1 = &x3a->tbl;
    iVar4 = x3a->count;
    x3a->count = iVar4 + 1;
    psVar7 = *ppsVar1 + iVar4;
    psVar7->key = in_RSI;
    psVar7->data = in_RDI;
    if (x3a->ht[uVar3] != (s_x3node *)0x0) {
      x3a->ht[uVar3]->from = &psVar7->next;
    }
    psVar7->next = x3a->ht[uVar3];
    x3a->ht[uVar3] = psVar7;
    psVar7->from = x3a->ht + uVar3;
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int State_insert(struct state *data, struct config *key)
{
  x3node *np;
  unsigned h;
  unsigned ph;

  if( x3a==0 ) return 0;
  ph = statehash(key);
  h = ph & (x3a->size-1);
  np = x3a->ht[h];
  while( np ){
    if( statecmp(np->key,key)==0 ){
      /* An existing entry with the same key is found. */
      /* Fail because overwrite is not allows. */
      return 0;
    }
    np = np->next;
  }
  if( x3a->count>=x3a->size ){
    /* Need to make the hash table bigger */
    int i,arrSize;
    struct s_x3 array;
    array.size = arrSize = x3a->size*2;
    array.count = x3a->count;
    array.tbl = (x3node*)calloc(arrSize, sizeof(x3node) + sizeof(x3node*));
    if( array.tbl==0 ) return 0;  /* Fail due to malloc failure */
    array.ht = (x3node**)&(array.tbl[arrSize]);
    for(i=0; i<arrSize; i++) array.ht[i] = 0;
    for(i=0; i<x3a->count; i++){
      x3node *oldnp, *newnp;
      oldnp = &(x3a->tbl[i]);
      h = statehash(oldnp->key) & (arrSize-1);
      newnp = &(array.tbl[i]);
      if( array.ht[h] ) array.ht[h]->from = &(newnp->next);
      newnp->next = array.ht[h];
      newnp->key = oldnp->key;
      newnp->data = oldnp->data;
      newnp->from = &(array.ht[h]);
      array.ht[h] = newnp;
    }
    free(x3a->tbl);
    *x3a = array;
  }
  /* Insert the new data */
  h = ph & (x3a->size-1);
  np = &(x3a->tbl[x3a->count++]);
  np->key = key;
  np->data = data;
  if( x3a->ht[h] ) x3a->ht[h]->from = &(np->next);
  np->next = x3a->ht[h];
  x3a->ht[h] = np;
  np->from = &(x3a->ht[h]);
  return 1;
}